

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codecs.cpp
# Opt level: O0

void __thiscall codecs_hex_decode_Test::~codecs_hex_decode_Test(codecs_hex_decode_Test *this)

{
  codecs_hex_decode_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(codecs, hex_decode)
{
    EXPECT_EQ(empty_buf, ST::hex_decode(ST::string()));
    EXPECT_EQ(cbuf(data_hex_ranges),
              ST::hex_decode(ST_LITERAL("000102030405060708090A0B0C0D0E0F10F0FF")));
    EXPECT_EQ(cbuf(data_hex_ranges),
              ST::hex_decode(ST_LITERAL("000102030405060708090a0b0c0d0e0f10f0ff")));

    EXPECT_EQ(cbuf(data_1), ST::hex_decode(ST_LITERAL("01")));
    EXPECT_EQ(cbuf(data_2), ST::hex_decode(ST_LITERAL("0102")));
    EXPECT_EQ(cbuf(data_3), ST::hex_decode(ST_LITERAL("010203")));
    EXPECT_EQ(cbuf(data_15),
              ST::hex_decode(ST_LITERAL("0102030405060708090A0B0C0D0E0F")));
    EXPECT_EQ(cbuf(data_16),
              ST::hex_decode(ST_LITERAL("0102030405060708090A0B0C0D0E0F10")));
    EXPECT_EQ(cbuf(data_17),
              ST::hex_decode(ST_LITERAL("0102030405060708090A0B0C0D0E0F1011")));
}